

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O1

string * test::loadPrivateKey_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *in_RDI;
  path pkf;
  ifstream private_key_linux;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  path local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  path local_288;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  path local_238;
  int aiStack_218 [122];
  
  local_2e8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test"
             ,"");
  paVar1 = &local_2c8.m_pathname.field_2;
  local_2c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"data","");
  boost::filesystem::path::operator/=((path *)local_2e8,&local_2c8);
  paVar2 = &local_238.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8) {
    local_238.m_pathname.field_2._8_4_ = local_2d8._8_4_;
    local_238.m_pathname.field_2._12_4_ = local_2d8._12_4_;
    local_238.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_238.m_pathname._M_dataplus._M_p = (pointer)local_2e8._0_8_;
  }
  local_238.m_pathname.field_2._M_allocated_capacity = local_2d8._0_8_;
  local_238.m_pathname._M_string_length = local_2e8._8_8_;
  local_2e8._8_8_ = 0;
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffffffffff00;
  paVar3 = &local_288.m_pathname.field_2;
  local_2e8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2d8;
  local_288.m_pathname._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"private_key.rsa","");
  boost::filesystem::path::operator/=(&local_238,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_pathname._M_dataplus._M_p == paVar2) {
    local_298._8_8_ =
         CONCAT44(local_238.m_pathname.field_2._12_4_,local_238.m_pathname.field_2._8_4_);
    local_2a8 = &local_298;
  }
  else {
    local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238.m_pathname._M_dataplus._M_p;
  }
  local_2a0 = local_238.m_pathname._M_string_length;
  local_238.m_pathname._M_string_length = 0;
  local_238.m_pathname.field_2._M_allocated_capacity =
       local_238.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_238.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_288.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8) {
    operator_delete((void *)local_2e8._0_8_);
  }
  std::ifstream::ifstream(&local_238,(string *)&local_2a8,_S_in);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x27);
  local_2c8.m_pathname._M_dataplus._M_p._0_1_ =
       *(int *)((long)aiStack_218 + *(long *)(local_238.m_pathname._M_dataplus._M_p + -0x18)) == 0;
  local_2c8.m_pathname._M_string_length = 0;
  local_2c8.m_pathname.field_2._M_allocated_capacity = 0;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_2e8._0_8_ = &PTR__lazy_ostream_00542cc0;
  local_2d8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8._8_8_ = "test file found";
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_260 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2c8.m_pathname.field_2._M_allocated_capacity);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>();
  std::ifstream::~ifstream(&local_238);
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  return in_RDI;
}

Assistant:

const std::string loadPrivateKey() {
	fs::path pkf = fs::path(PROJECT_TEST_SRC_DIR) / "data" / PRIVATE_KEY_FNAME;
	std::ifstream private_key_linux(pkf.string());
	BOOST_REQUIRE_MESSAGE(private_key_linux.good(), "test file found");
	const std::string pk_str((std::istreambuf_iterator<char>(private_key_linux)), std::istreambuf_iterator<char>());
	return pk_str;
}